

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O3

Dec_Graph_t *
Abc_ManResubQuit3(Abc_Obj_t *pRoot,Abc_Obj_t *pObj0,Abc_Obj_t *pObj1,Abc_Obj_t *pObj2,
                 Abc_Obj_t *pObj3,int fOrGate)

{
  Dec_Graph_t *pDVar1;
  Dec_Node_t *pDVar2;
  Dec_Edge_t DVar3;
  void *pvVar4;
  uint uVar5;
  void *pvVar6;
  uint uVar7;
  Dec_Edge_t DVar8;
  void *pvVar9;
  
  if (pObj0 == pObj1) {
    __assert_fail("pObj0 != pObj1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                  ,0x306,
                  "Dec_Graph_t *Abc_ManResubQuit3(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)"
                 );
  }
  if (pObj2 == pObj3) {
    __assert_fail("pObj2 != pObj3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                  ,0x307,
                  "Dec_Graph_t *Abc_ManResubQuit3(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)"
                 );
  }
  pDVar1 = (Dec_Graph_t *)calloc(1,0x20);
  pDVar1->nLeaves = 4;
  pDVar1->nCap = 0x3a;
  pDVar2 = (Dec_Node_t *)malloc(0x570);
  pDVar1->pNodes = pDVar2;
  pDVar2->eEdge0 = (Dec_Edge_t)0x0;
  pDVar2->eEdge1 = (Dec_Edge_t)0x0;
  (pDVar2->field_2).pFunc = (void *)0x0;
  pDVar2[1].field_2.pFunc = (void *)0x0;
  *(undefined8 *)&pDVar2[1].field_0x10 = 0;
  pDVar2[2].eEdge0 = (Dec_Edge_t)0x0;
  pDVar2[2].eEdge1 = (Dec_Edge_t)0x0;
  pDVar2[2].field_2.pFunc = (void *)0x0;
  pDVar2[3].field_2.pFunc = (void *)0x0;
  *(undefined8 *)&pDVar2[3].field_0x10 = 0;
  *(undefined8 *)&pDVar2->field_0x10 = 0;
  pDVar2[1].eEdge0 = (Dec_Edge_t)0x0;
  pDVar2[1].eEdge1 = (Dec_Edge_t)0x0;
  *(undefined8 *)&pDVar2[2].field_0x10 = 0;
  pDVar2[3].eEdge0 = (Dec_Edge_t)0x0;
  pDVar2[3].eEdge1 = (Dec_Edge_t)0x0;
  (pDVar2->field_2).pFunc = (void *)((ulong)pObj0 & 0xfffffffffffffffe);
  pvVar9 = (void *)((ulong)pObj1 & 0xfffffffffffffffe);
  pDVar2[1].field_2.pFunc = pvVar9;
  pvVar4 = (void *)((ulong)pObj2 & 0xfffffffffffffffe);
  pDVar2[2].field_2.pFunc = pvVar4;
  pvVar6 = (void *)((ulong)pObj3 & 0xfffffffffffffffe);
  pDVar2[3].field_2.pFunc = pvVar6;
  uVar7 = *(uint *)((long)((ulong)pObj0 & 0xfffffffffffffffe) + 0x14) >> 7;
  if (((ulong)pObj1 & 1) == 0 || ((ulong)pObj0 & 1) == 0) {
    DVar8 = (Dec_Edge_t)((uVar7 ^ (uint)pObj0) & 1);
    uVar7 = ((uint)pObj1 ^ *(uint *)((long)pvVar9 + 0x14) >> 7) & 1;
    pDVar2[4].field_2.pFunc = (void *)0x0;
    *(undefined8 *)&pDVar2[4].field_0x10 = 0;
    pDVar2[4].eEdge0 = DVar8;
    pDVar2[4].eEdge1 = (Dec_Edge_t)(uVar7 + 2);
    *(uint *)&pDVar2[4].field_0x10 = uVar7 << 0x10 | (int)DVar8 << 0xf;
    uVar7 = *(uint *)((long)pvVar6 + 0x14) >> 7;
    if (((ulong)pObj3 & 1) != 0 && ((ulong)pObj2 & 1) != 0) {
      uVar7 = uVar7 & 1;
      uVar5 = *(uint *)((long)pvVar4 + 0x14) >> 7 & 1;
      pDVar2[5].field_2.pFunc = (void *)0x0;
      *(undefined8 *)&pDVar2[5].field_0x10 = 0;
      *(uint *)&pDVar2[5].field_0x10 = uVar5 * 0x8000 + uVar7 * 0x10000 + 0x4000;
      pDVar2[5].eEdge0 = (Dec_Edge_t)(uVar5 ^ 5);
      pDVar2[5].eEdge1 = (Dec_Edge_t)(uVar7 ^ 7);
      DVar8 = (Dec_Edge_t)0x8;
LAB_0029a35a:
      DVar3 = (Dec_Edge_t)0xb;
      goto LAB_0029a35f;
    }
    uVar5 = (uVar7 ^ (uint)pObj3) & 1;
    uVar7 = (*(uint *)((long)pvVar4 + 0x14) >> 7 ^ (uint)pObj2) & 1;
    pDVar2[5].field_2.pFunc = (void *)0x0;
    *(undefined8 *)&pDVar2[5].field_0x10 = 0;
    pDVar2[5].eEdge0 = (Dec_Edge_t)(uVar7 + 4);
    pDVar2[5].eEdge1 = (Dec_Edge_t)(uVar5 + 6);
    *(uint *)&pDVar2[5].field_0x10 = uVar5 << 0x10 | uVar7 << 0xf;
    DVar8 = (Dec_Edge_t)0x8;
  }
  else {
    uVar7 = uVar7 & 1;
    uVar5 = *(uint *)((long)pvVar9 + 0x14) >> 7 & 1;
    pDVar2[4].field_2.pFunc = (void *)0x0;
    *(undefined8 *)&pDVar2[4].field_0x10 = 0;
    *(uint *)&pDVar2[4].field_0x10 = uVar7 * 0x8000 + uVar5 * 0x10000 + 0x4000;
    pDVar2[4].eEdge0 = (Dec_Edge_t)(uVar7 ^ 1);
    pDVar2[4].eEdge1 = (Dec_Edge_t)(uVar5 ^ 3);
    uVar7 = *(uint *)((long)pvVar6 + 0x14) >> 7;
    if (((ulong)pObj3 & 1) != 0 && ((ulong)pObj2 & 1) != 0) {
      uVar7 = uVar7 & 1;
      uVar5 = *(uint *)((long)pvVar4 + 0x14) >> 7 & 1;
      pDVar1->nSize = 6;
      pDVar2[5].field_2.pFunc = (void *)0x0;
      *(undefined8 *)&pDVar2[5].field_0x10 = 0;
      *(uint *)&pDVar2[5].field_0x10 = uVar5 * 0x8000 + uVar7 * 0x10000 + 0x4000;
      pDVar2[5].eEdge0 = (Dec_Edge_t)(uVar5 ^ 5);
      pDVar2[5].eEdge1 = (Dec_Edge_t)(uVar7 ^ 7);
      DVar8 = (Dec_Edge_t)0x9;
      goto LAB_0029a35a;
    }
    uVar5 = (uVar7 ^ (uint)pObj3) & 1;
    uVar7 = (*(uint *)((long)pvVar4 + 0x14) >> 7 ^ (uint)pObj2) & 1;
    pDVar2[5].field_2.pFunc = (void *)0x0;
    *(undefined8 *)&pDVar2[5].field_0x10 = 0;
    pDVar2[5].eEdge0 = (Dec_Edge_t)(uVar7 + 4);
    pDVar2[5].eEdge1 = (Dec_Edge_t)(uVar5 + 6);
    *(uint *)&pDVar2[5].field_0x10 = uVar5 << 0x10 | uVar7 << 0xf;
    DVar8 = (Dec_Edge_t)0x9;
  }
  DVar3 = (Dec_Edge_t)0xa;
LAB_0029a35f:
  pDVar1->nSize = 7;
  pDVar2[6].field_2.pFunc = (void *)0x0;
  *(undefined8 *)&pDVar2[6].field_0x10 = 0;
  if (fOrGate == 0) {
    pDVar2[6].eEdge0 = DVar8;
    pDVar2[6].eEdge1 = DVar3;
    *(uint *)&pDVar2[6].field_0x10 = ((uint)DVar3 & 1) << 0x10 | ((uint)DVar8 & 1) << 0xf;
    DVar8 = (Dec_Edge_t)0xc;
  }
  else {
    *(uint *)&pDVar2[6].field_0x10 =
         ((uint)DVar8 & 1) * 0x8000 + ((uint)DVar3 & 1) * 0x10000 + 0x4000;
    pDVar2[6].eEdge0 = (Dec_Edge_t)((uint)DVar8 ^ 1);
    pDVar2[6].eEdge1 = (Dec_Edge_t)((uint)DVar3 ^ 1);
    DVar8 = (Dec_Edge_t)0xd;
  }
  pDVar1->eRoot = DVar8;
  if ((pRoot->field_0x14 & 0x80) != 0) {
    pDVar1->eRoot = (Dec_Edge_t)((uint)DVar8 ^ 1);
  }
  return pDVar1;
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit3( Abc_Obj_t * pRoot, Abc_Obj_t * pObj0, Abc_Obj_t * pObj1, Abc_Obj_t * pObj2, Abc_Obj_t * pObj3, int fOrGate )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot, ePrev0, ePrev1, eNode0, eNode1, eNode2, eNode3;
    assert( pObj0 != pObj1 );
    assert( pObj2 != pObj3 );
    pGraph = Dec_GraphCreate( 4 );
    Dec_GraphNode( pGraph, 0 )->pFunc = Abc_ObjRegular(pObj0);
    Dec_GraphNode( pGraph, 1 )->pFunc = Abc_ObjRegular(pObj1);
    Dec_GraphNode( pGraph, 2 )->pFunc = Abc_ObjRegular(pObj2);
    Dec_GraphNode( pGraph, 3 )->pFunc = Abc_ObjRegular(pObj3);
    if ( Abc_ObjIsComplement(pObj0) && Abc_ObjIsComplement(pObj1) )
    {
        eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase );
        eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase );
        ePrev0 = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
        if ( Abc_ObjIsComplement(pObj2) && Abc_ObjIsComplement(pObj3) )
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase );
            ePrev1 = Dec_GraphAddNodeOr( pGraph, eNode2, eNode3 );
        }
        else
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase ^ Abc_ObjIsComplement(pObj2) );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase ^ Abc_ObjIsComplement(pObj3) );
            ePrev1 = Dec_GraphAddNodeAnd( pGraph, eNode2, eNode3 );
        }
    }
    else
    {
        eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase ^ Abc_ObjIsComplement(pObj0) );
        eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase ^ Abc_ObjIsComplement(pObj1) );
        ePrev0 = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
        if ( Abc_ObjIsComplement(pObj2) && Abc_ObjIsComplement(pObj3) )
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase );
            ePrev1 = Dec_GraphAddNodeOr( pGraph, eNode2, eNode3 );
        }
        else
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase ^ Abc_ObjIsComplement(pObj2) );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase ^ Abc_ObjIsComplement(pObj3) );
            ePrev1 = Dec_GraphAddNodeAnd( pGraph, eNode2, eNode3 );
        }
    }
    if ( fOrGate ) 
        eRoot = Dec_GraphAddNodeOr( pGraph, ePrev0, ePrev1 );
    else
        eRoot = Dec_GraphAddNodeAnd( pGraph, ePrev0, ePrev1 );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}